

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionError.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::PositionError::operator==(PositionError *this,PositionError *Value)

{
  KBOOL KVar1;
  KFIXED<short,_(unsigned_char)__b_> local_50 [2];
  KFIXED<short,_(unsigned_char)__b_> local_30;
  PositionError *local_20;
  PositionError *Value_local;
  PositionError *this_local;
  
  local_20 = Value;
  Value_local = this;
  KFIXED<short,_(unsigned_char)'\b'>::KFIXED(&local_30,&Value->m_HorzErr);
  KVar1 = KFIXED<short,_(unsigned_char)'\b'>::operator!=(&this->m_HorzErr,&local_30);
  KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(&local_30);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KFIXED<short,_(unsigned_char)'\b'>::KFIXED(local_50,&local_20->m_VertErr);
    KVar1 = KFIXED<short,_(unsigned_char)'\b'>::operator!=(&this->m_VertErr,local_50);
    KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(local_50);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL PositionError::operator == ( const PositionError & Value ) const
{
    if( m_HorzErr != Value.m_HorzErr )return false;
    if( m_VertErr != Value.m_VertErr )return false;
    return true;
}